

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O2

bool QLocalServerPrivate::removeServer(QString *name)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  undefined1 uVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  cVar4 = QString::startsWith((QChar)(char16_t)name,0x2f);
  if (cVar4 == '\0') {
    QDir::tempPath();
    QDir::cleanPath((QString *)&local_68);
    qVar3 = local_48.size;
    pcVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.d = local_68.d;
    local_48.ptr = local_68.ptr;
    local_68.d = pDVar1;
    local_68.ptr = pcVar2;
    local_48.size = local_68.size;
    local_68.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    local_68.d = (Data *)CONCAT62(local_68.d._2_6_,0x2f);
    local_68.ptr = (char16_t *)name;
    ::operator+=((QString *)&local_48,(QStringBuilder<char16_t,_const_QString_&> *)&local_68);
  }
  else {
    QString::operator=((QString *)&local_48,(QString *)name);
  }
  cVar4 = QFile::exists((QString *)&local_48);
  uVar5 = 1;
  if (cVar4 != '\0') {
    uVar5 = QFile::remove((QString *)&local_48);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServerPrivate::removeServer(const QString &name)
{
    QString fileName;
    if (name.startsWith(u'/')) {
        fileName = name;
    } else {
        fileName = QDir::cleanPath(QDir::tempPath());
        fileName += u'/' + name;
    }
    if (QFile::exists(fileName))
        return QFile::remove(fileName);
    else
        return true;
}